

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeXYZ.cpp
# Opt level: O3

ChNodeXYZ * __thiscall chrono::ChNodeXYZ::operator=(ChNodeXYZ *this,ChNodeXYZ *other)

{
  if (other != this) {
    ChNodeBase::operator=
              ((ChNodeBase *)
               ((long)(this->pos).m_data + *(long *)((long)this->super_ChLoadableUVW + -0x80) + -8),
               (ChNodeBase *)
               ((long)(other->pos).m_data + *(long *)((long)other->super_ChLoadableUVW + -0x80) + -8
               ));
    (this->pos).m_data[0] = (other->pos).m_data[0];
    (this->pos).m_data[1] = (other->pos).m_data[1];
    (this->pos).m_data[2] = (other->pos).m_data[2];
    (this->pos_dt).m_data[0] = (other->pos_dt).m_data[0];
    (this->pos_dt).m_data[1] = (other->pos_dt).m_data[1];
    (this->pos_dt).m_data[2] = (other->pos_dt).m_data[2];
    (this->pos_dtdt).m_data[0] = (other->pos_dtdt).m_data[0];
    (this->pos_dtdt).m_data[1] = (other->pos_dtdt).m_data[1];
    (this->pos_dtdt).m_data[2] = (other->pos_dtdt).m_data[2];
  }
  return this;
}

Assistant:

ChNodeXYZ& ChNodeXYZ::operator=(const ChNodeXYZ& other) {
    if (&other == this)
        return *this;

    ChNodeBase::operator=(other);

    pos = other.pos;
    pos_dt = other.pos_dt;
    pos_dtdt = other.pos_dtdt;

    return *this;
}